

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void gpu_register_built_in_renderers(void)

{
  GPU_RendererID id;
  GPU_RendererID id_00;
  GPU_RendererID id_01;
  GPU_RendererID id_02;
  GPU_RendererID id_03;
  GPU_RendererID local_90;
  GPU_RendererID local_78;
  GPU_RendererID local_60;
  GPU_RendererID local_48;
  GPU_RendererID local_30;
  
  GPU_MakeRendererID(&local_30,"OpenGL 1 BASE",1,1,1);
  id.renderer = local_30.renderer;
  id.major_version = local_30.major_version;
  id.name = local_30.name;
  id.minor_version = local_30.minor_version;
  id._20_4_ = local_30._20_4_;
  GPU_RegisterRenderer(id,GPU_CreateRenderer_OpenGL_1_BASE,GPU_FreeRenderer_OpenGL_1_BASE);
  GPU_MakeRendererID(&local_48,"OpenGL 1",2,1,1);
  id_00.renderer = local_48.renderer;
  id_00.major_version = local_48.major_version;
  id_00.name = local_48.name;
  id_00.minor_version = local_48.minor_version;
  id_00._20_4_ = local_48._20_4_;
  GPU_RegisterRenderer(id_00,GPU_CreateRenderer_OpenGL_1,GPU_FreeRenderer_OpenGL_1);
  GPU_MakeRendererID(&local_60,"OpenGL 2",3,2,0);
  id_01.renderer = local_60.renderer;
  id_01.major_version = local_60.major_version;
  id_01.name = local_60.name;
  id_01.minor_version = local_60.minor_version;
  id_01._20_4_ = local_60._20_4_;
  GPU_RegisterRenderer(id_01,GPU_CreateRenderer_OpenGL_2,GPU_FreeRenderer_OpenGL_2);
  GPU_MakeRendererID(&local_78,"OpenGL 3",4,3,0);
  id_02.renderer = local_78.renderer;
  id_02.major_version = local_78.major_version;
  id_02.name = local_78.name;
  id_02.minor_version = local_78.minor_version;
  id_02._20_4_ = local_78._20_4_;
  GPU_RegisterRenderer(id_02,GPU_CreateRenderer_OpenGL_3,GPU_FreeRenderer_OpenGL_3);
  GPU_MakeRendererID(&local_90,"OpenGL 4",5,4,0);
  id_03.renderer = local_90.renderer;
  id_03.major_version = local_90.major_version;
  id_03.name = local_90.name;
  id_03.minor_version = local_90.minor_version;
  id_03._20_4_ = local_90._20_4_;
  GPU_RegisterRenderer(id_03,GPU_CreateRenderer_OpenGL_4,GPU_FreeRenderer_OpenGL_4);
  return;
}

Assistant:

void gpu_register_built_in_renderers(void)
{
	#ifndef SDL_GPU_DISABLE_OPENGL
        #ifndef SDL_GPU_DISABLE_OPENGL_1_BASE
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 1 BASE", GPU_RENDERER_OPENGL_1_BASE, 1, 1),
                             &GPU_CreateRenderer_OpenGL_1_BASE,
                             &GPU_FreeRenderer_OpenGL_1_BASE);
        #endif
        
        #ifndef SDL_GPU_DISABLE_OPENGL_1
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 1", GPU_RENDERER_OPENGL_1, 1, 1),
                             &GPU_CreateRenderer_OpenGL_1,
                             &GPU_FreeRenderer_OpenGL_1);
        #endif
	
        #ifndef SDL_GPU_DISABLE_OPENGL_2
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 2", GPU_RENDERER_OPENGL_2, 2, 0),
                                 &GPU_CreateRenderer_OpenGL_2,
                                 &GPU_FreeRenderer_OpenGL_2);
        #endif
	
        #ifndef SDL_GPU_DISABLE_OPENGL_3
            #ifdef __MACOSX__
            // Depending on OS X version, it might only support core GL 3.3 or 3.2
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 2),
                                 &GPU_CreateRenderer_OpenGL_3,
                                 &GPU_FreeRenderer_OpenGL_3);
            #else
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 0),
                                 &GPU_CreateRenderer_OpenGL_3,
                                 &GPU_FreeRenderer_OpenGL_3);
            #endif
        #endif
	
        #ifndef SDL_GPU_DISABLE_OPENGL_4
            #ifdef __MACOSX__
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 1),
                                 &GPU_CreateRenderer_OpenGL_4,
                                 &GPU_FreeRenderer_OpenGL_4);
            #else
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 0),
                                 &GPU_CreateRenderer_OpenGL_4,
                                 &GPU_FreeRenderer_OpenGL_4);
            #endif
        #endif
    #endif
	
	#ifndef SDL_GPU_DISABLE_GLES
        #ifndef SDL_GPU_DISABLE_GLES_1
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGLES 1", GPU_RENDERER_GLES_1, 1, 1),
                             &GPU_CreateRenderer_GLES_1,
                             &GPU_FreeRenderer_GLES_1);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_2
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGLES 2", GPU_RENDERER_GLES_2, 2, 0),
                             &GPU_CreateRenderer_GLES_2,
                             &GPU_FreeRenderer_GLES_2);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_3
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGLES 3", GPU_RENDERER_GLES_3, 3, 0),
                             &GPU_CreateRenderer_GLES_3,
                             &GPU_FreeRenderer_GLES_3);
        #endif
    #endif
	
}